

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O0

void __thiscall FParser::PointlessBrackets(FParser *this,int *start,int *stop)

{
  bool bVar1;
  int local_28;
  int local_24;
  int i;
  int bracket_level;
  int *stop_local;
  int *start_local;
  FParser *this_local;
  
  while( true ) {
    bVar1 = false;
    if (*this->Tokens[*start] == '(') {
      bVar1 = *this->Tokens[*stop] == ')';
    }
    if (!bVar1) break;
    local_24 = 0;
    for (local_28 = *start; local_28 < *stop; local_28 = local_28 + 1) {
      if ((this->TokenType[local_28] == operator_) &&
         (local_24 = ((uint)(*this->Tokens[local_28] == '(') + local_24) -
                     (uint)(*this->Tokens[local_28] == ')'), local_24 == 0)) {
        return;
      }
    }
    *start = *start + 1;
    *stop = *stop + -1;
  }
  return;
}

Assistant:

void FParser::PointlessBrackets(int *start, int *stop)
{
	int bracket_level, i;
	
	// check that the start and end are brackets
	
	while(Tokens[*start][0] == '(' && Tokens[*stop][0] == ')')
    {
		
		bracket_level = 0;
		
		// confirm there are pointless brackets..
		// if they are, bracket_level will only get to 0
		// at the last token
		// check up to <*stop rather than <=*stop to ignore
		// the last token
		
		for(i = *start; i<*stop; i++)
		{
			if(TokenType[i] != operator_) continue; // ops only
			bracket_level += (Tokens[i][0] == '(');
			bracket_level -= (Tokens[i][0] == ')');
			if(bracket_level == 0) return; // stop if braces stop before end
		}
		
		// move both brackets in
		
		*start = *start + 1;
		*stop = *stop - 1;
    }
}